

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  char cVar2;
  Verbosity VVar3;
  pointer pnVar4;
  double dVar5;
  char *pcVar6;
  NameSet *this_01;
  bool bVar7;
  type_conflict5 tVar8;
  int iVar9;
  uint uVar10;
  double *pdVar11;
  ostream *poVar12;
  SPxOut *pSVar13;
  pointer pnVar14;
  SPxOut *pSVar15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  char *pcVar16;
  NameSet *pNVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  NameSet *local_788;
  NameSet *local_780;
  DIdxSet *local_778;
  Verbosity old_verbosity_1;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  uint local_740;
  uint uStack_73c;
  uint uStack_738;
  uint uStack_734;
  int local_730;
  bool local_72c;
  undefined8 local_728;
  SPxOut *local_720;
  Verbosity old_verbosity;
  uint uStack_714;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_710;
  undefined8 local_708;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_700;
  char local_6f8 [24];
  uint uStack_6e0;
  uint uStack_6dc;
  int iStack_6d8;
  bool bStack_6d4;
  undefined8 local_6d0;
  undefined1 local_619;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_610;
  SPxOut *local_608;
  NameSet *local_600;
  char rhsname [256];
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  vec;
  MPSInput local_488;
  _func_int **local_128;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_120;
  int local_118;
  int iStack_114;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_110;
  char local_108 [8];
  char acStack_100 [8];
  char local_f8 [8];
  undefined8 uStack_f0;
  int local_e8;
  char local_e4;
  fpclass_type local_e0;
  int32_t iStack_dc;
  _func_int **local_d8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_d0;
  int local_c8;
  int iStack_c4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_c0;
  char local_b8 [8];
  char acStack_b0 [8];
  char local_a8 [8];
  undefined8 uStack_a0;
  int local_98;
  char local_94;
  fpclass_type local_90;
  int32_t iStack_8c;
  _func_int **local_88;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_80;
  int local_78;
  int iStack_74;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_70;
  char local_68 [8];
  char acStack_60 [8];
  char local_58 [8];
  undefined8 uStack_50;
  int local_48;
  char local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_778 = p_intvars;
  local_600 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_788 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_788,1);
    p_cnames = local_788;
    NameSet::NameSet(local_788,10000,-1,2.0,2.0);
  }
  local_788 = p_cnames;
  NameSet::clear(p_cnames);
  pNVar17 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_780 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_780,1);
    pNVar17 = local_780;
    NameSet::NameSet(local_780,10000,-1,2.0,2.0);
  }
  this_00 = &this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_780 = pNVar17;
  NameSet::clear(pNVar17);
  clear(this);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::memRemax(&this_00->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,100000);
  local_610 = this_00;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reMax(this_00,10000);
  local_488._vptr_MPSInput = (_func_int **)&PTR__MPSInput_0053cf70;
  local_488.m_section = NAME;
  local_488.m_lineno = 0;
  local_488.m_objsense = MINIMIZE;
  local_488.m_has_error = false;
  local_488.m_buf[0] = '\0';
  local_488.m_is_integer = false;
  local_488.m_is_new_format = false;
  local_488.m_ignored = 0;
  local_488.m_objname[0] = '\0';
  local_488.m_f0 = (char *)0x0;
  local_488.m_f1 = (char *)0x0;
  local_488.m_f2 = (char *)0x0;
  local_488.m_f3 = (char *)0x0;
  local_488.m_f4 = (char *)0x0;
  local_488.m_f5 = (char *)0x0;
  local_488.m_probname[0] = '\0';
  local_488.m_input = p_input;
  MPSreadName(&local_488,this->spxout);
  if (local_488.m_section == OBJSEN) {
    MPSreadObjsen(&local_488);
  }
  if (local_488.m_section == OBJNAME) {
    MPSreadObjname(&local_488);
  }
  pNVar17 = local_780;
  if (local_488.m_section == ROWS) {
    pSVar15 = this->spxout;
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)rhsname,0);
    while (bVar7 = MPSInput::readLine(&local_488), bVar7) {
      if (local_488.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          _old_verbosity = (_func_int **)CONCAT44(uStack_714,pSVar15->m_verbosity);
          val.m_backend.data._M_elems[0] = 4;
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD02 Objective name : ");
          pSVar13 = soplex::operator<<(pSVar13,local_488.m_objname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity);
        }
        iVar9 = strcmp(local_488.m_f0,"COLUMNS");
        if (iVar9 == 0) {
          local_488.m_section = COLUMNS;
          goto LAB_002cb868;
        }
        break;
      }
      if ((local_488.m_f1 == (char *)0x0) || (local_488.m_f2 == (char *)0x0)) break;
      if (*local_488.m_f1 == 'N') {
        if (local_488.m_objname[0] == '\0') {
          MPSInput::setObjName(&local_488,local_488.m_f2);
        }
      }
      else {
        bVar7 = NameSet::has(pNVar17,local_488.m_f2);
        if (bVar7) break;
        NameSet::add(pNVar17,local_488.m_f2);
        cVar2 = *local_488.m_f1;
        if (cVar2 == 'E') {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
          rhsname[0x30] = local_6f8[0x10];
          rhsname[0x31] = local_6f8[0x11];
          rhsname[0x32] = local_6f8[0x12];
          rhsname[0x33] = local_6f8[0x13];
          rhsname[0x34] = local_6f8[0x14];
          rhsname[0x35] = local_6f8[0x15];
          rhsname[0x36] = local_6f8[0x16];
          rhsname[0x37] = local_6f8[0x17];
          rhsname[0x20] = local_6f8[0];
          rhsname[0x21] = local_6f8[1];
          rhsname[0x22] = local_6f8[2];
          rhsname[0x23] = local_6f8[3];
          rhsname[0x24] = local_6f8[4];
          rhsname[0x25] = local_6f8[5];
          rhsname[0x26] = local_6f8[6];
          rhsname[0x27] = local_6f8[7];
          rhsname[0x28] = local_6f8[8];
          rhsname[0x29] = local_6f8[9];
          rhsname[0x2a] = local_6f8[10];
          rhsname[0x2b] = local_6f8[0xb];
          rhsname[0x2c] = local_6f8[0xc];
          rhsname[0x2d] = local_6f8[0xd];
          rhsname[0x2e] = local_6f8[0xe];
          rhsname[0x2f] = local_6f8[0xf];
          rhsname._16_8_ = local_708;
          rhsname._24_8_ = pNStack_700;
          rhsname._0_8_ = _old_verbosity;
          rhsname._8_8_ = pNStack_710;
          rhsname[0x40] = (undefined1)iStack_6d8;
          rhsname[0x41] = iStack_6d8._1_1_;
          rhsname[0x42] = iStack_6d8._2_1_;
          rhsname[0x43] = iStack_6d8._3_1_;
          rhsname[0x44] = bStack_6d4;
          rhsname._72_8_ = local_6d0;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
        }
        else if (cVar2 == 'L') {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,-*pdVar11,(type *)0x0);
          rhsname[0x30] = local_6f8[0x10];
          rhsname[0x31] = local_6f8[0x11];
          rhsname[0x32] = local_6f8[0x12];
          rhsname[0x33] = local_6f8[0x13];
          rhsname[0x34] = local_6f8[0x14];
          rhsname[0x35] = local_6f8[0x15];
          rhsname[0x36] = local_6f8[0x16];
          rhsname[0x37] = local_6f8[0x17];
          rhsname[0x20] = local_6f8[0];
          rhsname[0x21] = local_6f8[1];
          rhsname[0x22] = local_6f8[2];
          rhsname[0x23] = local_6f8[3];
          rhsname[0x24] = local_6f8[4];
          rhsname[0x25] = local_6f8[5];
          rhsname[0x26] = local_6f8[6];
          rhsname[0x27] = local_6f8[7];
          rhsname[0x28] = local_6f8[8];
          rhsname[0x29] = local_6f8[9];
          rhsname[0x2a] = local_6f8[10];
          rhsname[0x2b] = local_6f8[0xb];
          rhsname[0x2c] = local_6f8[0xc];
          rhsname[0x2d] = local_6f8[0xd];
          rhsname[0x2e] = local_6f8[0xe];
          rhsname[0x2f] = local_6f8[0xf];
          rhsname._16_8_ = local_708;
          rhsname._24_8_ = pNStack_700;
          rhsname._0_8_ = _old_verbosity;
          rhsname._8_8_ = pNStack_710;
          rhsname[0x40] = (undefined1)iStack_6d8;
          rhsname[0x41] = iStack_6d8._1_1_;
          rhsname[0x42] = iStack_6d8._2_1_;
          rhsname[0x43] = iStack_6d8._3_1_;
          rhsname[0x44] = bStack_6d4;
          rhsname._72_8_ = local_6d0;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
        }
        else {
          if (cVar2 != 'G') break;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
          rhsname[0x30] = local_6f8[0x10];
          rhsname[0x31] = local_6f8[0x11];
          rhsname[0x32] = local_6f8[0x12];
          rhsname[0x33] = local_6f8[0x13];
          rhsname[0x34] = local_6f8[0x14];
          rhsname[0x35] = local_6f8[0x15];
          rhsname[0x36] = local_6f8[0x16];
          rhsname[0x37] = local_6f8[0x17];
          rhsname[0x20] = local_6f8[0];
          rhsname[0x21] = local_6f8[1];
          rhsname[0x22] = local_6f8[2];
          rhsname[0x23] = local_6f8[3];
          rhsname[0x24] = local_6f8[4];
          rhsname[0x25] = local_6f8[5];
          rhsname[0x26] = local_6f8[6];
          rhsname[0x27] = local_6f8[7];
          rhsname[0x28] = local_6f8[8];
          rhsname[0x29] = local_6f8[9];
          rhsname[0x2a] = local_6f8[10];
          rhsname[0x2b] = local_6f8[0xb];
          rhsname[0x2c] = local_6f8[0xc];
          rhsname[0x2d] = local_6f8[0xd];
          rhsname[0x2e] = local_6f8[0xe];
          rhsname[0x2f] = local_6f8[0xf];
          rhsname._16_4_ = (int)local_708;
          rhsname._20_4_ = local_708._4_4_;
          rhsname._24_8_ = pNStack_700;
          rhsname._0_8_ = _old_verbosity;
          rhsname._8_8_ = pNStack_710;
          rhsname[0x40] = (undefined1)iStack_6d8;
          rhsname[0x41] = iStack_6d8._1_1_;
          rhsname[0x42] = iStack_6d8._2_1_;
          rhsname[0x43] = iStack_6d8._3_1_;
          rhsname[0x44] = bStack_6d4;
          rhsname._72_8_ = local_6d0;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity,*pdVar11,(type *)0x0);
        }
        rhsname[0x80] = local_6f8[0x10];
        rhsname[0x81] = local_6f8[0x11];
        rhsname[0x82] = local_6f8[0x12];
        rhsname[0x83] = local_6f8[0x13];
        rhsname[0x84] = local_6f8[0x14];
        rhsname[0x85] = local_6f8[0x15];
        rhsname[0x86] = local_6f8[0x16];
        rhsname[0x87] = local_6f8[0x17];
        rhsname[0x70] = local_6f8[0];
        rhsname[0x71] = local_6f8[1];
        rhsname[0x72] = local_6f8[2];
        rhsname[0x73] = local_6f8[3];
        rhsname[0x74] = local_6f8[4];
        rhsname[0x75] = local_6f8[5];
        rhsname[0x76] = local_6f8[6];
        rhsname[0x77] = local_6f8[7];
        rhsname[0x78] = local_6f8[8];
        rhsname[0x79] = local_6f8[9];
        rhsname[0x7a] = local_6f8[10];
        rhsname[0x7b] = local_6f8[0xb];
        rhsname[0x7c] = local_6f8[0xc];
        rhsname[0x7d] = local_6f8[0xd];
        rhsname[0x7e] = local_6f8[0xe];
        rhsname[0x7f] = local_6f8[0xf];
        rhsname._96_8_ = local_708;
        rhsname._104_8_ = pNStack_700;
        rhsname._80_8_ = _old_verbosity;
        rhsname._88_8_ = pNStack_710;
        rhsname[0x90] = (undefined1)iStack_6d8;
        rhsname[0x91] = iStack_6d8._1_1_;
        rhsname[0x92] = iStack_6d8._2_1_;
        rhsname[0x93] = iStack_6d8._3_1_;
        rhsname[0x94] = bStack_6d4;
        rhsname._152_8_ = local_6d0;
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)rhsname);
      }
    }
    MPSInput::syntaxError(&local_488);
LAB_002cb868:
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(rhsname + 0xf0));
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])();
  this_01 = local_780;
  pNVar17 = local_788;
  if (local_488.m_section == COLUMNS) {
    val.m_backend.fpclass = cpp_dec_float_finite;
    val.m_backend.prec_elem = 0x10;
    val.m_backend.data._M_elems[0] = 0;
    val.m_backend.data._M_elems[1] = 0;
    val.m_backend.data._M_elems[2] = 0;
    val.m_backend.data._M_elems[3] = 0;
    val.m_backend.data._M_elems[4] = 0;
    val.m_backend.data._M_elems[5] = 0;
    val.m_backend.data._M_elems[6] = 0;
    val.m_backend.data._M_elems[7] = 0;
    val.m_backend.data._M_elems[8] = 0;
    val.m_backend.data._M_elems[9] = 0;
    val.m_backend.data._M_elems[10] = 0;
    val.m_backend.data._M_elems[0xb] = 0;
    val.m_backend.data._M_elems[0xc] = 0;
    val.m_backend.data._M_elems[0xd] = 0;
    val.m_backend.data._M_elems[0xe] = 0;
    val.m_backend.data._M_elems[0xf] = 0;
    val.m_backend.exp = 0;
    val.m_backend.neg = false;
    memset(&old_verbosity,0,0x100);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)rhsname,
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::DSVectorBase(&vec,8);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
    rhsname._172_4_ = uStack_764;
    rhsname._168_4_ = uStack_768;
    rhsname._180_4_ = uStack_75c;
    rhsname._176_4_ = local_760;
    rhsname._188_4_ = uStack_754;
    rhsname._184_4_ = uStack_758;
    rhsname._196_4_ = uStack_74c;
    rhsname._192_4_ = local_750;
    rhsname._204_4_ = uStack_744;
    rhsname._200_4_ = uStack_748;
    rhsname._212_4_ = uStack_73c;
    rhsname._208_4_ = local_740;
    rhsname._220_4_ = uStack_734;
    rhsname._216_4_ = uStack_738;
    rhsname._160_8_ = _old_verbosity_1;
    rhsname[0xe0] = (undefined1)local_730;
    rhsname[0xe1] = local_730._1_1_;
    rhsname[0xe2] = local_730._2_1_;
    rhsname[0xe3] = local_730._3_1_;
    rhsname[0xe4] = local_72c;
    vec.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    rhsname._232_8_ = local_728;
    while (bVar7 = MPSInput::readLine(&local_488), pcVar16 = local_488.m_f1, bVar7) {
      if (local_488.m_f0 != (char *)0x0) {
        iVar9 = strcmp(local_488.m_f0,"RHS");
        if (iVar9 == 0) {
          if ((undefined1)old_verbosity != ERROR) {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         *)(rhsname + 0xf0),
                        &vec.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(local_610,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)rhsname);
          }
          local_488.m_section = RHS;
          goto LAB_002cbec5;
        }
        break;
      }
      if (((local_488.m_f1 == (char *)0x0) || (local_488.m_f2 == (char *)0x0)) ||
         (local_488.m_f3 == (char *)0x0)) break;
      iVar9 = strcmp((char *)&old_verbosity,local_488.m_f1);
      if (iVar9 != 0) {
        if ((undefined1)old_verbosity != ERROR) {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)(rhsname + 0xf0),
                      &vec.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     );
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(local_610,
                (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)rhsname);
          pcVar16 = local_488.m_f1;
        }
        spxSnprintf((char *)&old_verbosity,0xff,"%s",pcVar16);
        local_619 = 0;
        iVar9 = (pNVar17->set).thesize;
        NameSet::add(pNVar17,(char *)&old_verbosity);
        if ((pNVar17->set).thesize <= iVar9) {
          poVar12 = std::operator<<((ostream *)&std::cerr,
                                    "ERROR in COLUMNS: duplicate column name or not column-wise ordering"
                                   );
          std::endl<char,std::char_traits<char>>(poVar12);
          break;
        }
        vec.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ._8_8_ = vec.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ._8_8_ & 0xffffffff;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
        rhsname._172_4_ = uStack_764;
        rhsname._168_4_ = uStack_768;
        rhsname._180_4_ = uStack_75c;
        rhsname._176_4_ = local_760;
        rhsname._188_4_ = uStack_754;
        rhsname._184_4_ = uStack_758;
        rhsname._196_4_ = uStack_74c;
        rhsname._192_4_ = local_750;
        rhsname._204_4_ = uStack_744;
        rhsname._200_4_ = uStack_748;
        rhsname._212_4_ = uStack_73c;
        rhsname._208_4_ = local_740;
        rhsname._220_4_ = uStack_734;
        rhsname._216_4_ = uStack_738;
        rhsname._160_8_ = _old_verbosity_1;
        rhsname[0xe0] = (undefined1)local_730;
        rhsname[0xe1] = local_730._1_1_;
        rhsname[0xe2] = local_730._2_1_;
        rhsname[0xe3] = local_730._3_1_;
        rhsname[0xe4] = local_72c;
        rhsname._232_8_ = local_728;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
        rhsname[0x84] = (undefined1)uStack_73c;
        rhsname[0x85] = uStack_73c._1_1_;
        rhsname[0x86] = uStack_73c._2_1_;
        rhsname[0x87] = uStack_73c._3_1_;
        rhsname[0x80] = (undefined1)local_740;
        rhsname[0x81] = local_740._1_1_;
        rhsname[0x82] = local_740._2_1_;
        rhsname[0x83] = local_740._3_1_;
        rhsname[0x74] = (undefined1)uStack_74c;
        rhsname[0x75] = uStack_74c._1_1_;
        rhsname[0x76] = uStack_74c._2_1_;
        rhsname[0x77] = uStack_74c._3_1_;
        rhsname[0x70] = (undefined1)local_750;
        rhsname[0x71] = local_750._1_1_;
        rhsname[0x72] = local_750._2_1_;
        rhsname[0x73] = local_750._3_1_;
        rhsname[0x7c] = (undefined1)uStack_744;
        rhsname[0x7d] = uStack_744._1_1_;
        rhsname[0x7e] = uStack_744._2_1_;
        rhsname[0x7f] = uStack_744._3_1_;
        rhsname[0x78] = (undefined1)uStack_748;
        rhsname[0x79] = uStack_748._1_1_;
        rhsname[0x7a] = uStack_748._2_1_;
        rhsname[0x7b] = uStack_748._3_1_;
        rhsname[100] = (undefined1)uStack_75c;
        rhsname[0x65] = uStack_75c._1_1_;
        rhsname[0x66] = uStack_75c._2_1_;
        rhsname[0x67] = uStack_75c._3_1_;
        rhsname[0x60] = (undefined1)local_760;
        rhsname[0x61] = local_760._1_1_;
        rhsname[0x62] = local_760._2_1_;
        rhsname[99] = local_760._3_1_;
        rhsname[0x6c] = (undefined1)uStack_754;
        rhsname[0x6d] = uStack_754._1_1_;
        rhsname[0x6e] = uStack_754._2_1_;
        rhsname[0x6f] = uStack_754._3_1_;
        rhsname[0x68] = (undefined1)uStack_758;
        rhsname[0x69] = uStack_758._1_1_;
        rhsname[0x6a] = uStack_758._2_1_;
        rhsname[0x6b] = uStack_758._3_1_;
        rhsname._80_8_ = _old_verbosity_1;
        rhsname[0x5c] = (undefined1)uStack_764;
        rhsname[0x5d] = uStack_764._1_1_;
        rhsname[0x5e] = uStack_764._2_1_;
        rhsname[0x5f] = uStack_764._3_1_;
        rhsname[0x58] = (undefined1)uStack_768;
        rhsname[0x59] = uStack_768._1_1_;
        rhsname[0x5a] = uStack_768._2_1_;
        rhsname[0x5b] = uStack_768._3_1_;
        rhsname[0x90] = (undefined1)local_730;
        rhsname[0x91] = local_730._1_1_;
        rhsname[0x92] = local_730._2_1_;
        rhsname[0x93] = local_730._3_1_;
        rhsname[0x94] = local_72c;
        rhsname._152_8_ = local_728;
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
        rhsname._12_4_ = uStack_764;
        rhsname._8_4_ = uStack_768;
        rhsname._20_4_ = uStack_75c;
        rhsname._16_4_ = local_760;
        rhsname._28_4_ = uStack_754;
        rhsname._24_4_ = uStack_758;
        rhsname._36_4_ = uStack_74c;
        rhsname._32_4_ = local_750;
        rhsname._44_4_ = uStack_744;
        rhsname._40_4_ = uStack_748;
        rhsname._52_4_ = uStack_73c;
        rhsname._48_4_ = local_740;
        rhsname._0_8_ = _old_verbosity_1;
        rhsname[0x40] = (undefined1)local_730;
        rhsname[0x41] = local_730._1_1_;
        rhsname[0x42] = local_730._2_1_;
        rhsname[0x43] = local_730._3_1_;
        rhsname[0x44] = local_72c;
        rhsname._72_8_ = local_728;
        if (local_488.m_is_integer == true) {
          if (local_778 != (DIdxSet *)0x0) {
            iVar9 = NameSet::number(pNVar17,(char *)&old_verbosity);
            DIdxSet::addIdx(local_778,iVar9);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,1.0,(type *)0x0);
          rhsname._12_4_ = uStack_764;
          rhsname._8_4_ = uStack_768;
          rhsname._20_4_ = uStack_75c;
          rhsname._16_4_ = local_760;
          rhsname._28_4_ = uStack_754;
          rhsname._24_4_ = uStack_758;
          rhsname._36_4_ = uStack_74c;
          rhsname._32_4_ = local_750;
          rhsname._44_4_ = uStack_744;
          rhsname._40_4_ = uStack_748;
          rhsname._52_4_ = uStack_73c;
          rhsname._48_4_ = local_740;
          rhsname._0_8_ = _old_verbosity_1;
          rhsname[0x40] = (undefined1)local_730;
          rhsname[0x41] = local_730._1_1_;
          rhsname[0x42] = local_730._2_1_;
          rhsname[0x43] = local_730._3_1_;
          rhsname[0x44] = local_72c;
          rhsname._72_8_ = local_728;
        }
      }
      dVar5 = atof(local_488.m_f3);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&val,dVar5);
      pcVar16 = local_488.m_f2;
      iVar9 = strcmp(local_488.m_f2,local_488.m_objname);
      if (iVar9 == 0) {
        rhsname._220_4_ = val.m_backend.data._M_elems[0xf];
        rhsname._216_4_ = val.m_backend.data._M_elems[0xe];
        rhsname._208_8_ = val.m_backend.data._M_elems._48_8_;
        rhsname._192_8_ = val.m_backend.data._M_elems._32_8_;
        rhsname._200_8_ = val.m_backend.data._M_elems._40_8_;
        rhsname._176_8_ = val.m_backend.data._M_elems._16_8_;
        rhsname._184_8_ = val.m_backend.data._M_elems._24_8_;
        rhsname._160_8_ = val.m_backend.data._M_elems._0_8_;
        rhsname._168_8_ = val.m_backend.data._M_elems._8_8_;
        rhsname[0xe0] = (undefined1)val.m_backend.exp;
        rhsname[0xe1] = val.m_backend.exp._1_1_;
        rhsname[0xe2] = val.m_backend.exp._2_1_;
        rhsname[0xe3] = val.m_backend.exp._3_1_;
        rhsname[0xe4] = val.m_backend.neg;
        rhsname._232_8_ = val.m_backend._72_8_;
      }
      else {
        iVar9 = NameSet::number(this_01,pcVar16);
        if (iVar9 < 0) {
          MPSInput::entryIgnored(&local_488,"Column",local_488.m_f1,"row",local_488.m_f2);
        }
        else {
          _old_verbosity_1 = (_func_int **)0x0;
          tVar8 = boost::multiprecision::operator!=(&val,(double *)&old_verbosity_1);
          if (tVar8) {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&vec,iVar9,&val);
          }
        }
      }
      if (local_488.m_f5 != (char *)0x0) {
        dVar5 = atof(local_488.m_f5);
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&val,dVar5);
        pcVar16 = local_488.m_f4;
        iVar9 = strcmp(local_488.m_f4,local_488.m_objname);
        if (iVar9 == 0) {
          rhsname._160_4_ = val.m_backend.data._M_elems[0];
          rhsname._164_4_ = val.m_backend.data._M_elems[1];
          rhsname._220_4_ = val.m_backend.data._M_elems[0xf];
          rhsname._216_4_ = val.m_backend.data._M_elems[0xe];
          rhsname._208_8_ = val.m_backend.data._M_elems._48_8_;
          rhsname._192_8_ = val.m_backend.data._M_elems._32_8_;
          rhsname._200_8_ = val.m_backend.data._M_elems._40_8_;
          rhsname._176_8_ = val.m_backend.data._M_elems._16_8_;
          rhsname._184_8_ = val.m_backend.data._M_elems._24_8_;
          rhsname._168_8_ = val.m_backend.data._M_elems._8_8_;
          rhsname._224_4_ = val.m_backend.exp;
          rhsname[0xe4] = val.m_backend.neg;
          rhsname._232_4_ = val.m_backend.fpclass;
          rhsname._236_4_ = val.m_backend.prec_elem;
        }
        else {
          iVar9 = NameSet::number(this_01,pcVar16);
          if (iVar9 < 0) {
            MPSInput::entryIgnored(&local_488,"Column",local_488.m_f1,"row",local_488.m_f4);
          }
          else {
            _old_verbosity_1 = (_func_int **)0x0;
            tVar8 = boost::multiprecision::operator!=(&val,(double *)&old_verbosity_1);
            if (tVar8) {
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(&vec,iVar9,&val);
            }
          }
        }
      }
    }
    MPSInput::syntaxError(&local_488);
LAB_002cbec5:
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~DSVectorBase(&vec);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(rhsname + 0xf0));
  }
  pNVar17 = local_780;
  if (local_488.m_section == RHS) {
    pSVar15 = this->spxout;
    memset(rhsname,0,0x100);
    memset(&old_verbosity,0,0x100);
    val.m_backend.fpclass = cpp_dec_float_finite;
    val.m_backend.prec_elem = 0x10;
    val.m_backend.data._M_elems[0] = 0;
    val.m_backend.data._M_elems[1] = 0;
    val.m_backend.data._M_elems[2] = 0;
    val.m_backend.data._M_elems[3] = 0;
    val.m_backend.data._M_elems[4] = 0;
    val.m_backend.data._M_elems[5] = 0;
    val.m_backend.data._M_elems[6] = 0;
    val.m_backend.data._M_elems[7] = 0;
    val.m_backend.data._M_elems[8] = 0;
    val.m_backend.data._M_elems[9] = 0;
    val.m_backend.data._M_elems[10] = 0;
    val.m_backend.data._M_elems[0xb] = 0;
    val.m_backend.data._M_elems[0xc] = 0;
    val.m_backend.data._M_elems[0xd] = 0;
    val.m_backend.data._M_elems[0xe] = 0;
    val.m_backend.data._M_elems[0xf] = 0;
    val.m_backend.exp = 0;
    val.m_backend.neg = false;
    while (bVar7 = MPSInput::readLine(&local_488), bVar7) {
      if (local_488.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          _old_verbosity_1 = (_func_int **)CONCAT44(uStack_76c,pSVar15->m_verbosity);
          vec._vptr_DSVectorBase = (_func_int **)CONCAT44(vec._vptr_DSVectorBase._4_4_,4);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD03 RHS name       : ");
          pSVar13 = soplex::operator<<(pSVar13,rhsname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity_1);
        }
        pcVar16 = local_488.m_f0;
        iVar9 = strcmp(local_488.m_f0,"RANGES");
        if (iVar9 == 0) {
          local_488.m_section = RANGES;
          goto LAB_002cc4e4;
        }
        iVar9 = strcmp(pcVar16,"BOUNDS");
        if (iVar9 == 0) {
          local_488.m_section = BOUNDS;
          goto LAB_002cc4e4;
        }
        iVar9 = strcmp(pcVar16,"ENDATA");
        if (iVar9 == 0) {
          local_488.m_section = ENDATA;
          goto LAB_002cc4e4;
        }
        break;
      }
      if ((local_488.m_f2 != (char *)0x0 && local_488.m_f3 == (char *)0x0) ||
         ((local_488.m_f4 != (char *)0x0 && (local_488.m_f5 == (char *)0x0)))) {
        MPSInput::insertName(&local_488,"_RHS_",false);
      }
      if (((local_488.m_f1 == (char *)0x0) || (local_488.m_f2 == (char *)0x0)) ||
         (local_488.m_f3 == (char *)0x0)) break;
      if (rhsname[0] == '\0') {
        spxSnprintf(rhsname,0x100,"%s",local_488.m_f1);
      }
      pcVar16 = local_488.m_f1;
      iVar9 = strcmp(rhsname,local_488.m_f1);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar17,local_488.m_f2);
        if ((int)uVar10 < 0) {
          MPSInput::entryIgnored(&local_488,"RHS",local_488.m_f1,"row",local_488.m_f2);
        }
        else {
          dVar5 = atof(local_488.m_f3);
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&val,dVar5);
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator<
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity_1);
          if (tVar8) {
            pnVar4 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
            puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
            puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
            pnVar14 = pnVar4 + uVar10;
            (pnVar14->m_backend).data._M_elems[0] = val.m_backend.data._M_elems[0];
            (pnVar14->m_backend).data._M_elems[1] = val.m_backend.data._M_elems[1];
            (pnVar14->m_backend).data._M_elems[2] = val.m_backend.data._M_elems[2];
            (pnVar14->m_backend).data._M_elems[3] = val.m_backend.data._M_elems[3];
            pnVar4[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar4[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar4[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar4[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
          }
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,-*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity_1);
          if (tVar8) {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
            *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                 val.m_backend.data._M_elems._8_8_;
            pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
          }
        }
        if (local_488.m_f5 != (char *)0x0) {
          uVar10 = NameSet::number(pNVar17,local_488.m_f4);
          if ((int)uVar10 < 0) {
            MPSInput::entryIgnored(&local_488,"RHS",local_488.m_f1,"row",local_488.m_f4);
          }
          else {
            dVar5 = atof(local_488.m_f5);
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&val,dVar5);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator<
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&old_verbosity_1);
            if (tVar8) {
              pnVar4 = (this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 0xc;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
              pnVar14 = pnVar4 + uVar10;
              (pnVar14->m_backend).data._M_elems[0] = val.m_backend.data._M_elems[0];
              (pnVar14->m_backend).data._M_elems[1] = val.m_backend.data._M_elems[1];
              (pnVar14->m_backend).data._M_elems[2] = val.m_backend.data._M_elems[2];
              (pnVar14->m_backend).data._M_elems[3] = val.m_backend.data._M_elems[3];
              pnVar4[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar4[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar4[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar4[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            }
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,-*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator>
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&old_verbosity_1);
            if (tVar8) {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
              *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
              *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                   val.m_backend.data._M_elems._8_8_;
              pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            }
          }
        }
      }
      else {
        iVar9 = strcmp((char *)&old_verbosity,pcVar16);
        if (((iVar9 != 0) &&
            (spxSnprintf((char *)&old_verbosity,0x100,"%s",pcVar16), pSVar15 != (SPxOut *)0x0)) &&
           (4 < (int)pSVar15->m_verbosity)) {
          _old_verbosity_1 = (_func_int **)CONCAT44(uStack_76c,pSVar15->m_verbosity);
          vec._vptr_DSVectorBase = (_func_int **)CONCAT44(vec._vptr_DSVectorBase._4_4_,5);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&vec);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD07 RHS ignored    : ");
          pSVar13 = soplex::operator<<(pSVar13,(char *)&old_verbosity);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
        }
      }
    }
    MPSInput::syntaxError(&local_488);
  }
LAB_002cc4e4:
  pNVar17 = local_780;
  if (local_488.m_section == RANGES) {
    pSVar15 = this->spxout;
    memset(rhsname,0,0x100);
    local_6d0._0_4_ = cpp_dec_float_finite;
    local_6d0._4_4_ = 0x10;
    _old_verbosity = (_func_int **)0x0;
    pNStack_710 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    local_6f8[0x10] = '\0';
    local_6f8[0x11] = '\0';
    local_6f8[0x12] = '\0';
    local_6f8[0x13] = '\0';
    local_6f8[0x14] = '\0';
    local_6f8[0x15] = '\0';
    local_6f8[0x16] = '\0';
    local_6f8[0x17] = '\0';
    uStack_6e0 = 0;
    uStack_6dc = 0;
    iStack_6d8 = 0;
    bStack_6d4 = false;
    local_708._0_4_ = 0;
    local_708._4_4_ = 0;
    pNStack_700 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    local_6f8[0] = '\0';
    local_6f8[1] = '\0';
    local_6f8[2] = '\0';
    local_6f8[3] = '\0';
    local_6f8[4] = '\0';
    local_6f8[5] = '\0';
    local_6f8[6] = '\0';
    local_6f8[7] = '\0';
    local_6f8[8] = '\0';
    local_6f8[9] = '\0';
    local_6f8[10] = '\0';
    local_6f8[0xb] = '\0';
    local_6f8[0xc] = '\0';
    local_6f8[0xd] = '\0';
    local_6f8[0xe] = '\0';
    local_6f8[0xf] = '\0';
    local_720 = (SPxOut *)
                &(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right;
    local_608 = (SPxOut *)
                &(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left;
LAB_002cc57a:
    bVar7 = MPSInput::readLine(&local_488);
    if (bVar7) {
      if (local_488.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          val.m_backend.data._M_elems[0] = pSVar15->m_verbosity;
          _old_verbosity_1 = (_func_int **)CONCAT44(uStack_76c,4);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD04 Range name     : ");
          pSVar13 = soplex::operator<<(pSVar13,rhsname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&val);
        }
        pcVar16 = local_488.m_f0;
        iVar9 = strcmp(local_488.m_f0,"BOUNDS");
        if (iVar9 == 0) {
          local_488.m_section = BOUNDS;
          goto LAB_002ccdba;
        }
        iVar9 = strcmp(pcVar16,"ENDATA");
        if (iVar9 == 0) {
          local_488.m_section = ENDATA;
          goto LAB_002ccdba;
        }
        goto LAB_002ccda6;
      }
      if ((local_488.m_f2 != (char *)0x0 && local_488.m_f3 == (char *)0x0) ||
         ((local_488.m_f4 != (char *)0x0 && (local_488.m_f5 == (char *)0x0)))) {
        MPSInput::insertName(&local_488,"_RNG_",false);
      }
      if (((local_488.m_f1 == (char *)0x0) || (local_488.m_f2 == (char *)0x0)) ||
         (local_488.m_f3 == (char *)0x0)) goto LAB_002ccda6;
      if (rhsname[0] == '\0') {
        spxSnprintf(rhsname,0x100,"%s");
      }
      iVar9 = strcmp(rhsname,local_488.m_f1);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar17,local_488.m_f2);
        if ((int)uVar10 < 0) {
          MPSInput::entryIgnored(&local_488,"Range",local_488.m_f1,"row",local_488.m_f2);
        }
        else {
          dVar5 = atof(local_488.m_f3);
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&old_verbosity,dVar5);
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&val.m_backend,-*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&val.m_backend);
          if (tVar8) {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator<
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&old_verbosity_1);
            if (tVar8) {
              val.m_backend.data._M_elems._0_8_ =
                   val.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar8 = boost::multiprecision::operator>=
                                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&old_verbosity,(int *)&val.m_backend);
              pSVar13 = local_608;
              if (tVar8) {
                pSVar13 = local_720;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)&pSVar13->_vptr_SPxOut)->
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,
                         (cpp_dec_float<100U,_int,_void> *)&old_verbosity);
              goto LAB_002cc9a0;
            }
          }
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&val.m_backend,-*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&val.m_backend);
          if (tVar8) {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            vec._vptr_DSVectorBase = _old_verbosity;
            vec.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .m_elem = pNStack_710;
            vec.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memsize = (int)local_708;
            vec.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused = local_708._4_4_;
            vec.theelem = pNStack_700;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((type *)&old_verbosity_1,(multiprecision *)&vec,arg);
            val.m_backend.fpclass = cpp_dec_float_finite;
            val.m_backend.prec_elem = 0x10;
            val.m_backend.data._M_elems[0] = 0;
            val.m_backend.data._M_elems[1] = 0;
            val.m_backend.data._M_elems[2] = 0;
            val.m_backend.data._M_elems[3] = 0;
            val.m_backend.data._M_elems[4] = 0;
            val.m_backend.data._M_elems[5] = 0;
            val.m_backend.data._M_elems[6] = 0;
            val.m_backend.data._M_elems[7] = 0;
            val.m_backend.data._M_elems[8] = 0;
            val.m_backend.data._M_elems[9] = 0;
            val.m_backend.data._M_elems[10] = 0;
            val.m_backend.data._M_elems[0xb] = 0;
            val.m_backend.data._M_elems[0xc] = 0;
            val.m_backend.data._M_elems[0xd] = 0;
            val.m_backend.data._M_elems[0xe] = 0;
            val.m_backend.data._M_elems[0xf] = 0;
            val.m_backend.exp = 0;
            val.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&val.m_backend,&pnVar14[uVar10].m_backend,
                       (cpp_dec_float<100U,_int,_void> *)&old_verbosity_1);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uStack_50 = CONCAT44(uStack_6dc,uStack_6e0);
            local_88 = _old_verbosity;
            pNStack_80 = pNStack_710;
            local_78 = (int)local_708;
            iStack_74 = local_708._4_4_;
            pNStack_70 = pNStack_700;
            local_68[0] = local_6f8[0];
            local_68[1] = local_6f8[1];
            local_68[2] = local_6f8[2];
            local_68[3] = local_6f8[3];
            local_68[4] = local_6f8[4];
            local_68[5] = local_6f8[5];
            local_68[6] = local_6f8[6];
            local_68[7] = local_6f8[7];
            acStack_60[0] = local_6f8[8];
            acStack_60[1] = local_6f8[9];
            acStack_60[2] = local_6f8[10];
            acStack_60[3] = local_6f8[0xb];
            acStack_60[4] = local_6f8[0xc];
            acStack_60[5] = local_6f8[0xd];
            acStack_60[6] = local_6f8[0xe];
            acStack_60[7] = local_6f8[0xf];
            local_58[0] = local_6f8[0x10];
            local_58[1] = local_6f8[0x11];
            local_58[2] = local_6f8[0x12];
            local_58[3] = local_6f8[0x13];
            local_58[4] = local_6f8[0x14];
            local_58[5] = local_6f8[0x15];
            local_58[6] = local_6f8[0x16];
            local_58[7] = local_6f8[0x17];
            local_48 = iStack_6d8;
            local_44 = bStack_6d4;
            local_40 = (fpclass_type)local_6d0;
            iStack_3c = local_6d0._4_4_;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((type *)&old_verbosity_1,(multiprecision *)&local_88,arg);
            val.m_backend.fpclass = cpp_dec_float_finite;
            val.m_backend.prec_elem = 0x10;
            val.m_backend.data._M_elems[0] = 0;
            val.m_backend.data._M_elems[1] = 0;
            val.m_backend.data._M_elems[2] = 0;
            val.m_backend.data._M_elems[3] = 0;
            val.m_backend.data._M_elems[4] = 0;
            val.m_backend.data._M_elems[5] = 0;
            val.m_backend.data._M_elems[6] = 0;
            val.m_backend.data._M_elems[7] = 0;
            val.m_backend.data._M_elems[8] = 0;
            val.m_backend.data._M_elems[9] = 0;
            val.m_backend.data._M_elems[10] = 0;
            val.m_backend.data._M_elems[0xb] = 0;
            val.m_backend.data._M_elems[0xc] = 0;
            val.m_backend.data._M_elems[0xd] = 0;
            val.m_backend.data._M_elems[0xe] = 0;
            val.m_backend.data._M_elems[0xf] = 0;
            val.m_backend.exp = 0;
            val.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&val.m_backend,&pnVar14[uVar10].m_backend,
                       (cpp_dec_float<100U,_int,_void> *)&old_verbosity_1);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
          *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
          *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
               val.m_backend.data._M_elems._8_8_;
          pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
          pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
          pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
          pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
        }
LAB_002cc9a0:
        if (local_488.m_f5 != (char *)0x0) {
          uVar10 = NameSet::number(pNVar17,local_488.m_f4);
          if (-1 < (int)uVar10) {
            dVar5 = atof(local_488.m_f5);
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&old_verbosity,dVar5);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,-*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator>
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&val.m_backend);
            if (tVar8) {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                        ((cpp_dec_float<100U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
              tVar8 = boost::multiprecision::operator<
                                (pnVar14 + uVar10,
                                 (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&old_verbosity_1);
              if (tVar8) {
                val.m_backend.data._M_elems._0_8_ =
                     val.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                tVar8 = boost::multiprecision::operator>=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&old_verbosity,(int *)&val.m_backend);
                pSVar13 = local_608;
                if (tVar8) {
                  pSVar13 = local_720;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)&pSVar13->_vptr_SPxOut)->
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,
                           (cpp_dec_float<100U,_int,_void> *)&old_verbosity);
                goto LAB_002cc57a;
              }
            }
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,-*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator>
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&val.m_backend);
            if (tVar8) {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uStack_a0 = CONCAT44(uStack_6dc,uStack_6e0);
              local_d8 = _old_verbosity;
              pNStack_d0 = pNStack_710;
              local_c8 = (int)local_708;
              iStack_c4 = local_708._4_4_;
              pNStack_c0 = pNStack_700;
              local_b8[0] = local_6f8[0];
              local_b8[1] = local_6f8[1];
              local_b8[2] = local_6f8[2];
              local_b8[3] = local_6f8[3];
              local_b8[4] = local_6f8[4];
              local_b8[5] = local_6f8[5];
              local_b8[6] = local_6f8[6];
              local_b8[7] = local_6f8[7];
              acStack_b0[0] = local_6f8[8];
              acStack_b0[1] = local_6f8[9];
              acStack_b0[2] = local_6f8[10];
              acStack_b0[3] = local_6f8[0xb];
              acStack_b0[4] = local_6f8[0xc];
              acStack_b0[5] = local_6f8[0xd];
              acStack_b0[6] = local_6f8[0xe];
              acStack_b0[7] = local_6f8[0xf];
              local_a8[0] = local_6f8[0x10];
              local_a8[1] = local_6f8[0x11];
              local_a8[2] = local_6f8[0x12];
              local_a8[3] = local_6f8[0x13];
              local_a8[4] = local_6f8[0x14];
              local_a8[5] = local_6f8[0x15];
              local_a8[6] = local_6f8[0x16];
              local_a8[7] = local_6f8[0x17];
              local_98 = iStack_6d8;
              local_94 = bStack_6d4;
              local_90 = (fpclass_type)local_6d0;
              iStack_8c = local_6d0._4_4_;
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((type *)&old_verbosity_1,(multiprecision *)&local_d8,arg_00);
              val.m_backend.fpclass = cpp_dec_float_finite;
              val.m_backend.prec_elem = 0x10;
              val.m_backend.data._M_elems[0] = 0;
              val.m_backend.data._M_elems[1] = 0;
              val.m_backend.data._M_elems[2] = 0;
              val.m_backend.data._M_elems[3] = 0;
              val.m_backend.data._M_elems[4] = 0;
              val.m_backend.data._M_elems[5] = 0;
              val.m_backend.data._M_elems[6] = 0;
              val.m_backend.data._M_elems[7] = 0;
              val.m_backend.data._M_elems[8] = 0;
              val.m_backend.data._M_elems[9] = 0;
              val.m_backend.data._M_elems[10] = 0;
              val.m_backend.data._M_elems[0xb] = 0;
              val.m_backend.data._M_elems[0xc] = 0;
              val.m_backend.data._M_elems[0xd] = 0;
              val.m_backend.data._M_elems[0xe] = 0;
              val.m_backend.data._M_elems[0xf] = 0;
              val.m_backend.exp = 0;
              val.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&val.m_backend,&pnVar14[uVar10].m_backend,
                         (cpp_dec_float<100U,_int,_void> *)&old_verbosity_1);
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uStack_f0 = CONCAT44(uStack_6dc,uStack_6e0);
              local_128 = _old_verbosity;
              pNStack_120 = pNStack_710;
              local_118 = (int)local_708;
              iStack_114 = local_708._4_4_;
              pNStack_110 = pNStack_700;
              local_108[0] = local_6f8[0];
              local_108[1] = local_6f8[1];
              local_108[2] = local_6f8[2];
              local_108[3] = local_6f8[3];
              local_108[4] = local_6f8[4];
              local_108[5] = local_6f8[5];
              local_108[6] = local_6f8[6];
              local_108[7] = local_6f8[7];
              acStack_100[0] = local_6f8[8];
              acStack_100[1] = local_6f8[9];
              acStack_100[2] = local_6f8[10];
              acStack_100[3] = local_6f8[0xb];
              acStack_100[4] = local_6f8[0xc];
              acStack_100[5] = local_6f8[0xd];
              acStack_100[6] = local_6f8[0xe];
              acStack_100[7] = local_6f8[0xf];
              local_f8[0] = local_6f8[0x10];
              local_f8[1] = local_6f8[0x11];
              local_f8[2] = local_6f8[0x12];
              local_f8[3] = local_6f8[0x13];
              local_f8[4] = local_6f8[0x14];
              local_f8[5] = local_6f8[0x15];
              local_f8[6] = local_6f8[0x16];
              local_f8[7] = local_6f8[0x17];
              local_e8 = iStack_6d8;
              local_e4 = bStack_6d4;
              local_e0 = (fpclass_type)local_6d0;
              iStack_dc = local_6d0._4_4_;
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((type *)&old_verbosity_1,(multiprecision *)&local_128,arg_00);
              val.m_backend.fpclass = cpp_dec_float_finite;
              val.m_backend.prec_elem = 0x10;
              val.m_backend.data._M_elems[0] = 0;
              val.m_backend.data._M_elems[1] = 0;
              val.m_backend.data._M_elems[2] = 0;
              val.m_backend.data._M_elems[3] = 0;
              val.m_backend.data._M_elems[4] = 0;
              val.m_backend.data._M_elems[5] = 0;
              val.m_backend.data._M_elems[6] = 0;
              val.m_backend.data._M_elems[7] = 0;
              val.m_backend.data._M_elems[8] = 0;
              val.m_backend.data._M_elems[9] = 0;
              val.m_backend.data._M_elems[10] = 0;
              val.m_backend.data._M_elems[0xb] = 0;
              val.m_backend.data._M_elems[0xc] = 0;
              val.m_backend.data._M_elems[0xd] = 0;
              val.m_backend.data._M_elems[0xe] = 0;
              val.m_backend.data._M_elems[0xf] = 0;
              val.m_backend.exp = 0;
              val.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        (&val.m_backend,&pnVar14[uVar10].m_backend,
                         (cpp_dec_float<100U,_int,_void> *)&old_verbosity_1);
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
            *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                 val.m_backend.data._M_elems._8_8_;
            pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            goto LAB_002cc57a;
          }
          MPSInput::entryIgnored(&local_488,"Range",local_488.m_f1,"row",local_488.m_f4);
        }
      }
      goto LAB_002cc57a;
    }
LAB_002ccda6:
    MPSInput::syntaxError(&local_488);
  }
LAB_002ccdba:
  pNVar17 = local_788;
  if (local_488.m_section == BOUNDS) {
    local_720 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)&old_verbosity_1,8);
    memset(rhsname,0,0x100);
    local_6d0._0_4_ = cpp_dec_float_finite;
    local_6d0._4_4_ = 0x10;
    _old_verbosity = (_func_int **)0x0;
    pNStack_710 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    local_708._0_4_ = 0;
    local_708._4_4_ = 0;
    pNStack_700 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    local_6f8[0] = '\0';
    local_6f8[1] = '\0';
    local_6f8[2] = '\0';
    local_6f8[3] = '\0';
    local_6f8[4] = '\0';
    local_6f8[5] = '\0';
    local_6f8[6] = '\0';
    local_6f8[7] = '\0';
    local_6f8[8] = '\0';
    local_6f8[9] = '\0';
    local_6f8[10] = '\0';
    local_6f8[0xb] = '\0';
    local_6f8[0xc] = '\0';
    local_6f8[0xd] = '\0';
    local_6f8[0xe] = '\0';
    local_6f8[0xf] = '\0';
    local_6f8[0x10] = '\0';
    local_6f8[0x11] = '\0';
    local_6f8[0x12] = '\0';
    local_6f8[0x13] = '\0';
    local_6f8[0x14] = '\0';
    local_6f8[0x15] = '\0';
    local_6f8[0x16] = '\0';
    local_6f8[0x17] = '\0';
    uStack_6e0 = 0;
    uStack_6dc = 0;
    iStack_6d8 = 0;
    bStack_6d4 = false;
LAB_002cce44:
    bVar7 = MPSInput::readLine(&local_488);
    pSVar15 = local_720;
    if (bVar7) {
      if (local_488.m_f0 != (char *)0x0) {
        if ((local_720 != (SPxOut *)0x0) && (3 < (int)local_720->m_verbosity)) {
          val.m_backend.data._M_elems[0] = local_720->m_verbosity;
          vec._vptr_DSVectorBase = (_func_int **)CONCAT44(vec._vptr_DSVectorBase._4_4_,4);
          (*local_720->_vptr_SPxOut[2])(local_720);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD05 Bound name     : ");
          pSVar13 = soplex::operator<<(pSVar13,rhsname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&val);
        }
        iVar9 = strcmp(local_488.m_f0,"ENDATA");
        if (iVar9 == 0) {
          local_488.m_section = ENDATA;
          goto LAB_002cd549;
        }
        goto switchD_002cd1da_caseD_4e;
      }
      cVar2 = *local_488.m_f1;
      pcVar16 = local_488.m_f3;
      pcVar6 = local_488.m_f2;
      if (cVar2 == 'F') {
        if (local_488.m_f1[1] == 'X') goto LAB_002ccea5;
      }
      else if (cVar2 == 'U') {
        if ((local_488.m_f1[1] == 'I') || (local_488.m_f1[1] == 'P')) goto LAB_002ccea5;
      }
      else if ((cVar2 == 'L') && ((local_488.m_f1[1] == 'I' || (local_488.m_f1[1] == 'O')))) {
LAB_002ccea5:
        if (local_488.m_f1[2] == '\0') {
          pcVar16 = local_488.m_f4;
          pcVar6 = local_488.m_f3;
        }
      }
      if ((((pcVar6 != (char *)0x0) && (pcVar16 == (char *)0x0)) &&
          (MPSInput::insertName(&local_488,"_BND_",true), local_488.m_f1 == (char *)0x0)) ||
         ((local_488.m_f2 == (char *)0x0 || (local_488.m_f3 == (char *)0x0))))
      goto switchD_002cd1da_caseD_4e;
      if (rhsname[0] == '\0') {
        spxSnprintf(rhsname,0x100,"%s");
      }
      iVar9 = strcmp(rhsname,local_488.m_f2);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar17,local_488.m_f3);
        pcVar16 = local_488.m_f4;
        if (-1 < (int)uVar10) {
          if (local_488.m_f4 == (char *)0x0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&old_verbosity,0.0);
          }
          else {
            iVar9 = strcmp(local_488.m_f4,"-Inf");
            if ((iVar9 == 0) || (iVar9 = strcmp(pcVar16,"-inf"), iVar9 == 0)) {
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,-*pdVar11,(type *)0x0);
            }
            else {
              iVar9 = strcmp(pcVar16,"Inf");
              if ((((iVar9 != 0) && (iVar9 = strcmp(pcVar16,"inf"), iVar9 != 0)) &&
                  (iVar9 = strcmp(pcVar16,"+Inf"), iVar9 != 0)) &&
                 (iVar9 = strcmp(pcVar16,"+inf"), iVar9 != 0)) {
                dVar5 = atof(pcVar16);
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)&old_verbosity,dVar5);
                goto LAB_002cd102;
              }
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,*pdVar11,(type *)0x0);
            }
            local_6f8._16_8_ = val.m_backend.data._M_elems._48_8_;
            uStack_6e0 = val.m_backend.data._M_elems[0xe];
            uStack_6dc = val.m_backend.data._M_elems[0xf];
            local_6f8._0_8_ = val.m_backend.data._M_elems._32_8_;
            local_6f8._8_8_ = val.m_backend.data._M_elems._40_8_;
            local_708._0_4_ = val.m_backend.data._M_elems[4];
            local_708._4_4_ = val.m_backend.data._M_elems[5];
            pNStack_700 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)val.m_backend.data._M_elems._24_8_;
            _old_verbosity = (_func_int **)val.m_backend.data._M_elems._0_8_;
            pNStack_710 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)val.m_backend.data._M_elems._8_8_;
            iStack_6d8 = val.m_backend.exp;
            bStack_6d4 = val.m_backend.neg;
            local_6d0._0_4_ = val.m_backend.fpclass;
            local_6d0._4_4_ = val.m_backend.prec_elem;
          }
LAB_002cd102:
          if (local_488.m_f1[1] == 'I') {
            if (local_778 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_778,uVar10);
            }
            iVar9 = IdxSet::pos((IdxSet *)&old_verbosity_1,uVar10);
            if (iVar9 < 0) {
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,*pdVar11,(type *)0x0);
              pnVar14 = (this->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
              *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
              *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                   val.m_backend.data._M_elems._8_8_;
              pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
              DIdxSet::addIdx((DIdxSet *)&old_verbosity_1,uVar10);
            }
          }
          cVar2 = *local_488.m_f1;
          switch(cVar2) {
          case 'L':
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            break;
          case 'M':
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,-*pdVar11,(type *)0x0);
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_002cd331;
          case 'N':
          case 'O':
          case 'Q':
          case 'R':
          case 'S':
          case 'T':
            goto switchD_002cd1da_caseD_4e;
          case 'P':
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,*pdVar11,(type *)0x0);
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_002cd331:
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
            *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                 val.m_backend.data._M_elems._8_8_;
            pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            goto LAB_002cce44;
          case 'U':
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            break;
          default:
            if (cVar2 == 'B') {
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)
                         ((this->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar10),0.0);
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)
                         ((this->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar10),1.0);
              if (local_778 != (DIdxSet *)0x0) {
                DIdxSet::addIdx(local_778,uVar10);
              }
              goto LAB_002cce44;
            }
            if (cVar2 != 'F') goto switchD_002cd1da_caseD_4e;
            if (local_488.m_f1[1] != 'X') {
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,-*pdVar11,(type *)0x0);
              pnVar4 = (this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 0xc;
              *puVar1 = val.m_backend.data._M_elems[0xc];
              puVar1[1] = val.m_backend.data._M_elems[0xd];
              puVar1[2] = val.m_backend.data._M_elems[0xe];
              puVar1[3] = val.m_backend.data._M_elems[0xf];
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 8;
              *puVar1 = val.m_backend.data._M_elems[8];
              puVar1[1] = val.m_backend.data._M_elems[9];
              puVar1[2] = val.m_backend.data._M_elems[10];
              puVar1[3] = val.m_backend.data._M_elems[0xb];
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 4;
              *puVar1 = val.m_backend.data._M_elems[4];
              puVar1[1] = val.m_backend.data._M_elems[5];
              puVar1[2] = val.m_backend.data._M_elems[6];
              puVar1[3] = val.m_backend.data._M_elems[7];
              pnVar14 = pnVar4 + uVar10;
              (pnVar14->m_backend).data._M_elems[0] = val.m_backend.data._M_elems[0];
              (pnVar14->m_backend).data._M_elems[1] = val.m_backend.data._M_elems[1];
              (pnVar14->m_backend).data._M_elems[2] = val.m_backend.data._M_elems[2];
              (pnVar14->m_backend).data._M_elems[3] = val.m_backend.data._M_elems[3];
              pnVar4[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar4[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar4[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar4[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,*pdVar11,(type *)0x0);
              pnVar14 = (this->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._48_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[0xf],val.m_backend.data._M_elems[0xe]);
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._32_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._40_8_;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(undefined8 *)(puVar1 + 2) = val.m_backend.data._M_elems._24_8_;
              *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
              *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                   val.m_backend.data._M_elems._8_8_;
              pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
              goto LAB_002cce44;
            }
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar1 = local_6f8._16_8_;
            *(ulong *)(puVar1 + 2) = CONCAT44(uStack_6dc,uStack_6e0);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
            *(undefined8 *)puVar1 = local_6f8._0_8_;
            *(undefined8 *)(puVar1 + 2) = local_6f8._8_8_;
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            puVar1[0] = (int)local_708;
            puVar1[1] = local_708._4_4_;
            *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              **)(puVar1 + 2) = pNStack_700;
            *(_func_int ***)&pnVar14[uVar10].m_backend.data = _old_verbosity;
            *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              **)(pnVar14[uVar10].m_backend.data._M_elems + 2) = pNStack_710;
            pnVar14[uVar10].m_backend.exp = iStack_6d8;
            pnVar14[uVar10].m_backend.neg = bStack_6d4;
            pnVar14[uVar10].m_backend.fpclass = (fpclass_type)local_6d0;
            pnVar14[uVar10].m_backend.prec_elem = local_6d0._4_4_;
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar1 = local_6f8._16_8_;
          *(ulong *)(puVar1 + 2) = CONCAT44(uStack_6dc,uStack_6e0);
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar1 = local_6f8._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_6f8._8_8_;
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
          puVar1[0] = (int)local_708;
          puVar1[1] = local_708._4_4_;
          *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            **)(puVar1 + 2) = pNStack_700;
          *(_func_int ***)&pnVar14[uVar10].m_backend.data = _old_verbosity;
          *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            **)(pnVar14[uVar10].m_backend.data._M_elems + 2) = pNStack_710;
          pnVar14[uVar10].m_backend.exp = iStack_6d8;
          pnVar14[uVar10].m_backend.neg = bStack_6d4;
          pnVar14[uVar10].m_backend.fpclass = (fpclass_type)local_6d0;
          pnVar14[uVar10].m_backend.prec_elem = local_6d0._4_4_;
          goto LAB_002cce44;
        }
        MPSInput::entryIgnored(&local_488,"column",local_488.m_f3,"bound",rhsname);
      }
      goto LAB_002cce44;
    }
switchD_002cd1da_caseD_4e:
    MPSInput::syntaxError(&local_488);
LAB_002cd549:
    DIdxSet::~DIdxSet((DIdxSet *)&old_verbosity_1);
  }
  if (local_488.m_section != ENDATA) {
    MPSInput::syntaxError(&local_488);
  }
  if (local_488.m_has_error == true) {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x1b])();
  }
  else {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])
              (this,(ulong)(((local_488.m_objsense != MINIMIZE) - 1) +
                           (uint)(local_488.m_objsense != MINIMIZE)));
    pSVar15 = this->spxout;
    if ((pSVar15 != (SPxOut *)0x0) && (VVar3 = pSVar15->m_verbosity, 3 < (int)VVar3)) {
      rhsname[0] = (char)VVar3;
      rhsname[1] = (char)(VVar3 >> 8);
      rhsname[2] = (char)(VVar3 >> 0x10);
      rhsname[3] = (char)(VVar3 >> 0x18);
      _old_verbosity = (_func_int **)CONCAT44(uStack_714,4);
      (*pSVar15->_vptr_SPxOut[2])();
      pSVar15 = soplex::operator<<(this->spxout,"IMPSRD06 Objective sense: ");
      pcVar16 = "Maximize\n";
      if (local_488.m_objsense == MINIMIZE) {
        pcVar16 = "Minimize\n";
      }
      soplex::operator<<(pSVar15,pcVar16);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,rhsname);
    }
    added2Set(this,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this,
              &local_610->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thenum);
  }
  if (local_600 == (NameSet *)0x0) {
    NameSet::~NameSet(local_788);
    free(local_788);
    local_788 = (NameSet *)0x0;
  }
  if (p_rnames == (NameSet *)0x0) {
    NameSet::~NameSet(local_780);
    free(local_780);
  }
  return (bool)(local_488.m_has_error ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}